

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O2

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 *puVar3;
  string local_80;
  string local_60 [32];
  string progName;
  
  iVar1 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  std::__cxx11::string::string((string *)&progName,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<((ostream *)&std::cerr,"PARSE ERROR: ");
  ArgException::argId_abi_cxx11_(&local_80,e);
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"             ");
  std::__cxx11::string::string(local_60,(string *)&e->_errorText);
  poVar2 = std::operator<<(poVar2,local_60);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&local_80);
  iVar1 = (*_cmd->_vptr_CmdLineInterface[0xf])(_cmd);
  if ((char)iVar1 == '\0') {
    (*(this->super_CmdLineOutput)._vptr_CmdLineOutput[2])(this,_cmd);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Brief USAGE: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    _shortUsage(this,_cmd,(ostream *)&std::cerr);
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar2 = std::operator<<(poVar2,"For complete USAGE and HELP type: ");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"   ");
    poVar2 = std::operator<<(poVar2,(string *)&progName);
    poVar2 = std::operator<<(poVar2," ");
    Arg::nameStartString_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,"help");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_80);
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " "
					  << Arg::nameStartString() << "help"
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}